

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O0

void __thiscall soplex::SoPlexBase<double>::_enableSimplifierAndScaler(SoPlexBase<double> *this)

{
  SPxSimplifier<double> *pSVar1;
  int iVar2;
  SoPlexBase<double> *in_RDI;
  
  iVar2 = intParam(in_RDI,SIMPLIFIER);
  switch(iVar2) {
  case 0:
    in_RDI->_simplifier = (SPxSimplifier<double> *)0x0;
    break;
  case 1:
  case 3:
    in_RDI->_simplifier = &(in_RDI->_simplifierMainSM).super_SPxSimplifier<double>;
    pSVar1 = in_RDI->_simplifier;
    realParam(in_RDI,MINRED);
    (*pSVar1->_vptr_SPxSimplifier[0x12])();
    break;
  case 2:
    in_RDI->_simplifier = &(in_RDI->_simplifierMainSM).super_SPxSimplifier<double>;
    pSVar1 = in_RDI->_simplifier;
    realParam(in_RDI,MINRED);
    (*pSVar1->_vptr_SPxSimplifier[0x12])();
  }
  iVar2 = intParam(in_RDI,SCALER);
  switch(iVar2) {
  case 0:
    in_RDI->_scaler = (SPxScaler<double> *)0x0;
    break;
  case 1:
    in_RDI->_scaler = &(in_RDI->_scalerUniequi).super_SPxScaler<double>;
    break;
  case 2:
    in_RDI->_scaler = &(in_RDI->_scalerBiequi).super_SPxScaler<double>;
    break;
  case 3:
    in_RDI->_scaler = &(in_RDI->_scalerGeo1).super_SPxScaler<double>;
    break;
  case 4:
    in_RDI->_scaler = &(in_RDI->_scalerGeo8).super_SPxScaler<double>;
    break;
  case 5:
    in_RDI->_scaler = &(in_RDI->_scalerLeastsq).super_SPxScaler<double>;
    break;
  case 6:
    in_RDI->_scaler = &(in_RDI->_scalerGeoequi).super_SPxScaler<double>;
  }
  return;
}

Assistant:

void SoPlexBase<R>::_enableSimplifierAndScaler()
{
   // type of simplifier
   switch(intParam(SoPlexBase<R>::SIMPLIFIER))
   {
   case SIMPLIFIER_OFF:
      _simplifier = nullptr;
#ifdef SOPLEX_WITH_MPFR
      _boostedSimplifier = nullptr;
#endif
      break;

   case SIMPLIFIER_AUTO:
   case SIMPLIFIER_INTERNAL:
      _simplifier = &_simplifierMainSM;
      assert(_simplifier != nullptr);
      _simplifier->setMinReduction(realParam(MINRED));
#ifdef SOPLEX_WITH_MPFR
      _boostedSimplifier = &_boostedSimplifierMainSM;
      assert(_boostedSimplifier != nullptr);
      _boostedSimplifier->setMinReduction(realParam(MINRED));
#endif
      break;

   case SIMPLIFIER_PAPILO:
#ifdef SOPLEX_WITH_PAPILO
      _simplifier = &_simplifierPaPILO;
      assert(_simplifier != nullptr);
#ifdef SOPLEX_WITH_MPFR
      _boostedSimplifier = &_boostedSimplifierPaPILO;
      assert(_boostedSimplifier != nullptr);
#endif
#else
      _simplifier = &_simplifierMainSM;
      assert(_simplifier != nullptr);
      _simplifier->setMinReduction(realParam(MINRED));
#ifdef SOPLEX_WITH_MPFR
      _boostedSimplifier = &_boostedSimplifierMainSM;
      assert(_boostedSimplifier != nullptr);
      _boostedSimplifier->setMinReduction(realParam(MINRED));
#endif // !SOPLEX_WITH_MPFR
#endif // SOPLEX_WITH_PAPILO
      break;

   default:
      break;
   }

   // type of scaler
   switch(intParam(SoPlexBase<R>::SCALER))
   {
   case SCALER_OFF:
      _scaler = nullptr;
#ifdef SOPLEX_WITH_MPFR
      _boostedScaler = nullptr;
#endif
      break;

   case SCALER_UNIEQUI:
      _scaler = &_scalerUniequi;
#ifdef SOPLEX_WITH_MPFR
      _boostedScaler = &_boostedScalerUniequi;
#endif
      break;

   case SCALER_BIEQUI:
      _scaler = &_scalerBiequi;
#ifdef SOPLEX_WITH_MPFR
      _boostedScaler = &_boostedScalerBiequi;
#endif
      break;

   case SCALER_GEO1:
      _scaler = &_scalerGeo1;
#ifdef SOPLEX_WITH_MPFR
      _boostedScaler = &_boostedScalerGeo1;
#endif
      break;

   case SCALER_GEO8:
      _scaler = &_scalerGeo8;
#ifdef SOPLEX_WITH_MPFR
      _boostedScaler = &_boostedScalerGeo8;
#endif
      break;

   case SCALER_LEASTSQ:
      _scaler = &_scalerLeastsq;
#ifdef SOPLEX_WITH_MPFR
      _boostedScaler = &_boostedScalerLeastsq;
#endif
      break;

   case SCALER_GEOEQUI:
      _scaler = &_scalerGeoequi;
#ifdef SOPLEX_WITH_MPFR
      _boostedScaler = &_boostedScalerGeoequi;
#endif
      break;

   default:
      break;
   }
}